

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPMCQueue.h
# Opt level: O3

void __thiscall
rigtorp::mpmc::
Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
::~Queue(Queue<std::unique_ptr<int,_std::default_delete<int>_>,_std::allocator<rigtorp::mpmc::Slot<std::unique_ptr<int,_std::default_delete<int>_>_>_>_>
         *this)

{
  Slot<std::unique_ptr<int,_std::default_delete<int>_>_> *pSVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  
  if (this->capacity_ == 0) {
    uVar4 = 0x40;
  }
  else {
    lVar3 = 8;
    uVar4 = 0;
    do {
      pSVar1 = this->slots_;
      if ((*(ulong *)((long)pSVar1 + lVar3 + -8) & 1) != 0) {
        pvVar2 = *(void **)((long)&(pSVar1->turn).super___atomic_base<unsigned_long>._M_i + lVar3);
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2,4);
        }
        *(undefined8 *)((long)&(pSVar1->turn).super___atomic_base<unsigned_long>._M_i + lVar3) = 0;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x40;
    } while (uVar4 < this->capacity_);
    uVar4 = this->capacity_ * 0x40 + 0x40;
  }
  operator_delete(this->slots_,uVar4,0x40);
  return;
}

Assistant:

~Queue() noexcept {
    for (size_t i = 0; i < capacity_; ++i) {
      slots_[i].~Slot();
    }
    allocator_.deallocate(slots_, capacity_ + 1);
  }